

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servak.cpp
# Opt level: O3

void __thiscall listener::do_accept(listener *this)

{
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  bind_front_wrapper<void_(listener::*)(boost::system::error_code,_boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>),_std::shared_ptr<listener>_>
  local_48;
  strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_> local_28;
  
  local_48.h_ = (offset_in_listener_to_subr)this->ioc_;
  local_48._12_4_ = 0;
  boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>::
  strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>
            ((strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>> *)
             &local_28,(basic_executor_type<std::allocator<void>,_0U> *)&local_48,(type *)0x0);
  std::__shared_ptr<listener,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<listener,void>
            ((__shared_ptr<listener,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (__weak_ptr<listener,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_48.h_ = (offset_in_listener_to_subr)on_accept;
  local_48._8_8_ = 0;
  local_48.args_.
  super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<listener>_>.
  super_tuple_element_impl<0UL,_std::shared_ptr<listener>_>.t.
  super___shared_ptr<listener,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
  local_48.args_.
  super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<listener>_>.
  super_tuple_element_impl<0UL,_std::shared_ptr<listener>_>.t.
  super___shared_ptr<listener,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Stack_50;
  local_58 = (element_type *)0x0;
  p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::
  async_move_accept<boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>,boost::beast::detail::bind_front_wrapper<void(listener::*)(boost::system::error_code,boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>),std::shared_ptr<listener>>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
            ((this->acceptor_).impl_.service_,&(this->acceptor_).impl_.implementation_,&local_28,
             (endpoint_type *)0x0,&local_48,&(this->acceptor_).impl_.executor_);
  if (local_48.args_.
      super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<listener>_>
      .super_tuple_element_impl<0UL,_std::shared_ptr<listener>_>.t.
      super___shared_ptr<listener,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.args_.
               super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<listener>_>
               .super_tuple_element_impl<0UL,_std::shared_ptr<listener>_>.t.
               super___shared_ptr<listener,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
  }
  if (local_28.impl_.
      super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.impl_.
               super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void
    do_accept()
    {
        // The new connection gets its own strand
        acceptor_.async_accept(
            net::make_strand(ioc_),
            beast::bind_front_handler(
                &listener::on_accept,
                shared_from_this()));
    }